

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

size_t roaring_bitmap_frozen_size_in_bytes(roaring_bitmap_t *rb)

{
  uint8_t uVar1;
  uint uVar2;
  sbyte sVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  uVar2 = (rb->high_low_container).size;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  lVar6 = 0;
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    uVar1 = (rb->high_low_container).typecodes[uVar4];
    if (uVar1 == '\x01') {
      lVar7 = 0x2000;
    }
    else {
      sVar3 = 2;
      if (uVar1 != '\x03') {
        sVar3 = 1;
      }
      lVar7 = (long)*(rb->high_low_container).containers[uVar4] << sVar3;
    }
    lVar6 = lVar6 + lVar7;
  }
  return (long)(int)uVar2 * 5 + lVar6 + 4;
}

Assistant:

size_t roaring_bitmap_frozen_size_in_bytes(const roaring_bitmap_t *rb) {
    const roaring_array_t *ra = &rb->high_low_container;
    size_t num_bytes = 0;
    for (int32_t i = 0; i < ra->size; i++) {
        switch (ra->typecodes[i]) {
            case BITSET_CONTAINER_TYPE: {
                num_bytes += BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
                break;
            }
            case RUN_CONTAINER_TYPE: {
                const run_container_t *rc = const_CAST_run(ra->containers[i]);
                num_bytes += rc->n_runs * sizeof(rle16_t);
                break;
            }
            case ARRAY_CONTAINER_TYPE: {
                const array_container_t *ac =
                    const_CAST_array(ra->containers[i]);
                num_bytes += ac->cardinality * sizeof(uint16_t);
                break;
            }
            default:
                roaring_unreachable;
        }
    }
    num_bytes += (2 + 2 + 1) * ra->size;  // keys, counts, typecodes
    num_bytes += 4;                       // header
    return num_bytes;
}